

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O1

nbt_node * nbt_clone(nbt_node *tree)

{
  nbt_type nVar1;
  char *pcVar2;
  undefined8 uVar3;
  nbt_node *__ptr;
  size_t sVar4;
  char *__dest;
  int *piVar5;
  nbt_list *__dest_00;
  size_t __n;
  
  if (tree == (nbt_node *)0x0) goto LAB_0010417e;
  nVar1 = tree->type;
  if (nVar1 == TAG_INVALID) {
    __assert_fail("tree->type != TAG_INVALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x85,"nbt_node *nbt_clone(nbt_node *)");
  }
  __ptr = (nbt_node *)malloc(0x20);
  if (__ptr == (nbt_node *)0x0) {
    piVar5 = __errno_location();
    *piVar5 = -2;
    goto LAB_0010417e;
  }
  __ptr->type = nVar1;
  pcVar2 = tree->name;
  if (pcVar2 == (char *)0x0) {
LAB_00104149:
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    __dest = (char *)malloc(sVar4 + 1);
    if (__dest == (char *)0x0) goto LAB_00104149;
    strcpy(__dest,pcVar2);
  }
  __ptr->name = __dest;
  if (pcVar2 != (char *)0x0 && __dest == (char *)0x0) goto LAB_00104160;
  switch(nVar1) {
  case TAG_BYTE_ARRAY:
    sVar4 = (size_t)(tree->payload).tag_byte_array.length;
    __n = sVar4;
    goto LAB_001041da;
  case TAG_STRING:
    pcVar2 = (tree->payload).tag_string;
    sVar4 = strlen(pcVar2);
    __dest_00 = (nbt_list *)malloc(sVar4 + 1);
    if (__dest_00 == (nbt_list *)0x0) {
      __dest_00 = (nbt_list *)0x0;
    }
    else {
      strcpy((char *)__dest_00,pcVar2);
    }
    (__ptr->payload).tag_string = (char *)__dest_00;
    break;
  case TAG_LIST:
  case TAG_COMPOUND:
    __dest_00 = clone_list((tree->payload).tag_list);
    (__ptr->payload).tag_list = __dest_00;
    break;
  case TAG_INT_ARRAY:
    __n = (size_t)(tree->payload).tag_byte_array.length;
    sVar4 = __n * 4;
LAB_001041da:
    __dest_00 = (nbt_list *)malloc(sVar4);
    if (__dest_00 == (nbt_list *)0x0) {
      piVar5 = __errno_location();
      *piVar5 = -2;
    }
    else {
      memcpy(__dest_00,(tree->payload).tag_byte_array.data,__n);
      (__ptr->payload).tag_byte_array.data = (uchar *)__dest_00;
      (__ptr->payload).tag_byte_array.length = (int32_t)__n;
    }
    break;
  default:
    uVar3 = *(undefined8 *)((long)&tree->payload + 8);
    (__ptr->payload).tag_long = (tree->payload).tag_long;
    *(undefined8 *)((long)&__ptr->payload + 8) = uVar3;
    return __ptr;
  }
  if (__dest_00 == (nbt_list *)0x0) {
LAB_00104160:
    free(__ptr->name);
    free(__ptr);
LAB_0010417e:
    __ptr = (nbt_node *)0x0;
  }
  return __ptr;
}

Assistant:

nbt_node* nbt_clone(nbt_node* tree)
{
    if(tree == NULL) return NULL;
    assert(tree->type != TAG_INVALID);

    nbt_node* ret = NULL;
    CHECKED_MALLOC(ret, sizeof *ret, return NULL);

    ret->type = tree->type;
    ret->name = safe_strdup(tree->name);

    if(tree->name && ret->name == NULL) goto clone_error;

    if(tree->type == TAG_STRING)
    {
        ret->payload.tag_string = _nbt_strdup(tree->payload.tag_string);
        if(ret->payload.tag_string == NULL) goto clone_error;
    }

    else if(tree->type == TAG_BYTE_ARRAY)
    {
        unsigned char* newbuf;
        CHECKED_MALLOC(newbuf, tree->payload.tag_byte_array.length, goto clone_error);

        memcpy(newbuf,
               tree->payload.tag_byte_array.data,
               tree->payload.tag_byte_array.length);

        ret->payload.tag_byte_array.data   = newbuf;
        ret->payload.tag_byte_array.length = tree->payload.tag_byte_array.length;
    }

    else if(tree->type == TAG_INT_ARRAY)
    {
        int32_t* newbuf;
        CHECKED_MALLOC(newbuf, tree->payload.tag_int_array.length * sizeof(int32_t), goto clone_error);

        memcpy(newbuf,
               tree->payload.tag_int_array.data,
               tree->payload.tag_int_array.length);

        ret->payload.tag_int_array.data   = newbuf;
        ret->payload.tag_int_array.length = tree->payload.tag_int_array.length;
    }

    else if(tree->type == TAG_LIST)
    {
        ret->payload.tag_list = clone_list(tree->payload.tag_list);
        if(ret->payload.tag_list == NULL) goto clone_error;
    }
    else if(tree->type == TAG_COMPOUND)
    {
        ret->payload.tag_compound = clone_list(tree->payload.tag_compound);
        if(ret->payload.tag_compound == NULL) goto clone_error;
    }
    else
    {
        ret->payload = tree->payload;
    }

    return ret;

clone_error:
    if(ret) free(ret->name);

    free(ret);
    return NULL;
}